

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> * __thiscall
cs::
allocator_type<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
::alloc<>(allocator_type<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
          *this)

{
  _List_node_base *p_Var1;
  __int_type_conflict _Var2;
  holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *phVar3;
  holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *in_RDI;
  new_allocator<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>_>
  *unaff_retaddr;
  holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *ptr;
  void *pvVar4;
  
  pvVar4 = (void *)0x0;
  phVar3 = in_RDI;
  if (in_RDI[0x10].mDat.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDI);
    if (_Var2 == 0) {
      p_Var1 = in_RDI[0x10].mDat.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      in_RDI[0x10].mDat.super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)((long)&p_Var1[-1]._M_prev + 7);
      phVar3 = *(holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> **)
                ((long)in_RDI + (long)p_Var1 * 8 + -8);
      goto LAB_0023d11a;
    }
  }
  phVar3 = __gnu_cxx::
           new_allocator<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>_>
           ::allocate(unaff_retaddr,(size_type)phVar3,pvVar4);
LAB_0023d11a:
  __gnu_cxx::
  new_allocator<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>>
  ::construct<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>>
            ((new_allocator<cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>_>
              *)phVar3,in_RDI);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}